

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

uint16_t invert(uint16_t x,uint16_t q,uint64_t qrecip)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined2 in_register_00000032;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar4 = (uint)x;
  uVar3 = CONCAT22(in_register_00000032,q) - 2;
  uVar5 = 1;
  uVar2 = 1;
  do {
    uVar4 = uVar4 & 0xffff;
    if ((uVar3 & uVar5) != 0) {
      iVar1 = uVar2 * uVar4 -
              (uint)(ushort)((uVar2 * uVar4) * qrecip >> 0x30) * CONCAT22(in_register_00000032,q);
      iVar6 = 0;
      if (-1 < (short)((short)iVar1 - q)) {
        iVar6 = CONCAT22(in_register_00000032,q);
      }
      uVar2 = iVar1 - iVar6;
      uVar3 = uVar3 & ~uVar5;
      if (uVar3 == 0) {
        return (uint16_t)uVar2;
      }
      uVar2 = uVar2 & 0xffff;
    }
    iVar1 = uVar4 * uVar4 -
            (uint)(ushort)((uVar4 * uVar4) * qrecip >> 0x30) * CONCAT22(in_register_00000032,q);
    iVar6 = 0;
    if (-1 < (short)((short)iVar1 - q)) {
      iVar6 = CONCAT22(in_register_00000032,q);
    }
    uVar4 = iVar1 - iVar6;
    uVar5 = uVar5 * 2;
  } while( true );
}

Assistant:

static uint16_t invert(uint16_t x, uint16_t q, uint64_t qrecip)
{
    /* Fermat inversion: compute x^(q-2), since x^(q-1) == 1. */
    uint32_t sq = x, bit = 1, acc = 1, exp = q-2;
    while (1) {
        if (exp & bit) {
            acc = reduce(acc * sq, q, qrecip);
            exp &= ~bit;
            if (!exp)
                return acc;
        }
        sq = reduce(sq * sq, q, qrecip);
        bit <<= 1;
    }
}